

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cond.cpp
# Opt level: O0

String * __thiscall
Hpipe::Cond::ko_cpp(String *__return_storage_ptr__,Cond *this,String *var,Cond *not_in)

{
  String local_68;
  undefined1 local_48 [8];
  Cond tmp;
  Cond *not_in_local;
  String *var_local;
  Cond *this_local;
  
  tmp.p.super__Base_bitset<4UL>._M_w[3] = (_WordT)not_in;
  operator~((Cond *)local_48,this);
  std::__cxx11::string::string((string *)&local_68,(string *)var);
  ok_cpp(__return_storage_ptr__,(Cond *)local_48,&local_68,
         (Cond *)tmp.p.super__Base_bitset<4UL>._M_w[3]);
  std::__cxx11::string::~string((string *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

String Cond::ko_cpp( String var, const Cond *not_in ) const {
    Cond tmp = ~ *this;
    return tmp.ok_cpp( var, not_in );
}